

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

double celero::timer::CachePerformanceFrequency(bool quiet)

{
  ostream *poVar1;
  undefined7 in_register_00000039;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((int)CONCAT71(in_register_00000039,quiet) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Timer resolution: ",0x12);
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_30,vsnprintf,0x148,"%f",0x3f50624dd2f1a9fc);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_30._M_dataplus._M_p,local_30._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," us",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return 0.001;
}

Assistant:

double celero::timer::CachePerformanceFrequency(bool quiet)
{
#ifdef _WIN32
	QueryPerformanceFrequency(&QPCFrequency);
	if(QPCFrequency.QuadPart == 0)
	{
		return 0;
	}

	auto precision = ((1.0 / static_cast<double>(QPCFrequency.QuadPart)) * 1000000.0);
#else
	if(static_cast<double>(std::chrono::high_resolution_clock::period::den) == 0)
	{
		return 0;
	}

	auto precision =
		(static_cast<double>(std::chrono::high_resolution_clock::period::num) / static_cast<double>(std::chrono::high_resolution_clock::period::den))
		* 1000000.0;
#endif

	if(quiet == false)
	{
		std::cout << "Timer resolution: " << std::to_string(precision) << " us" << std::endl;
	}

	return precision;
}